

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_scanner_tokenAsString(sysbvm_context_t *context,size_t stringSize,uint8_t *string)

{
  uint8_t uVar1;
  size_t stringSize_00;
  sysbvm_tuple_t sVar2;
  ulong uStack_40;
  uint8_t c;
  size_t i;
  uint8_t *destination;
  sysbvm_tuple_t allocatedString;
  size_t requiredStringSize;
  uint8_t *string_local;
  size_t stringSize_local;
  sysbvm_context_t *context_local;
  
  if (stringSize < 2) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/scanner.c:109: assertion failure: stringSize >= 2"
              );
  }
  stringSize_00 = countSizeRequiredForString(stringSize - 2,string + 1);
  sVar2 = sysbvm_string_createEmptyWithSize(context,stringSize_00);
  i = sVar2 + 0x10;
  for (uStack_40 = 1; uStack_40 < stringSize - 1; uStack_40 = uStack_40 + 1) {
    if (string[uStack_40] == '\\') {
      uStack_40 = uStack_40 + 1;
      uVar1 = string[uStack_40];
      if (uVar1 == 'n') {
        *(undefined1 *)i = 10;
      }
      else if (uVar1 == 'r') {
        *(undefined1 *)i = 0xd;
      }
      else if (uVar1 == 't') {
        *(undefined1 *)i = 9;
      }
      else {
        *(uint8_t *)i = uVar1;
      }
    }
    else {
      *(uint8_t *)i = string[uStack_40];
    }
    i = i + 1;
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_scanner_tokenAsString(sysbvm_context_t *context, size_t stringSize, const uint8_t *string)
{
    SYSBVM_ASSERT(stringSize >= 2);

    size_t requiredStringSize = countSizeRequiredForString(stringSize - 2, string + 1);
    sysbvm_tuple_t allocatedString = sysbvm_string_createEmptyWithSize(context, requiredStringSize);
    uint8_t *destination = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(allocatedString)->bytes;
    for(size_t i = 1; i < stringSize - 1; ++i)
    {
        uint8_t c = string[i];
        if(c == '\\')
        {
            ++i;
            c = string[i];
            switch(c)
            {
            case 't':
                *destination++ = '\t';
                break;
            case 'r':
                *destination++ = '\r';
                break;
            case 'n':
                *destination++ = '\n';
                break;
            default:
                *destination++ = c;
                break;
            }
        }
        else
        {
            *destination++ = c;
        }
    }

    return allocatedString;
}